

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  undefined4 *puVar1;
  SecondaryAllocator *pSVar2;
  PageAllocatorBaseCommon *pPVar3;
  HANDLE pVVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  int iVar9;
  uint index;
  uint uVar10;
  uint index_00;
  BOOL BVar11;
  HANDLE pVVar12;
  AllocatorType *pAVar13;
  BVIndex BVar14;
  char *pcVar15;
  ulong uVar16;
  undefined8 *in_FS_OFFSET;
  DWORD local_4c;
  char *pcStack_48;
  DWORD oldProtect;
  char *local_40;
  uint local_38;
  BOOL local_34;
  
  if (this->freePageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar6) goto LAB_00262ddb;
    *puVar1 = 0;
  }
  BVar14 = this->freePageCount;
  this_00 = &this->freePages;
  BVar8 = BVStatic<272UL>::Count(this_00);
  if (BVar14 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar6) goto LAB_00262ddb;
    *puVar1 = 0;
  }
  if (this->freePageCount < pageCount) {
LAB_00262a55:
    pcStack_48 = (char *)0x0;
  }
  else {
    if ((this->freePageCount == 0 && this->decommitPageCount == 0) ||
       ((pSVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator,
        pSVar2 != (SecondaryAllocator *)0x0 &&
        (iVar9 = (*pSVar2->_vptr_SecondaryAllocator[3])(), (char)iVar9 == '\0')))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar6) {
LAB_00262ddb:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar1 = 0;
    }
    index = BVStatic<272UL>::GetNextBit(this_00,0);
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    pcStack_48 = (char *)(ulong)(pageCount << 0xc);
    local_38 = index;
    do {
      while( true ) {
        if (index == 0xffffffff) goto LAB_00262a55;
        pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar13 = &pPVar3[-1].allocatorType;
        if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        if (pAVar13[0x28] <= index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                             "index < this->GetAllocator()->GetMaxAllocPageCount()");
          if (!bVar6) goto LAB_00262ddb;
          *puVar1 = 0;
        }
        uVar10 = GetAvailablePageCount(this);
        if (uVar10 - index < pageCount) goto LAB_00262a55;
        index_00 = local_38;
        if ((pageCount == 1) ||
           (BVar7 = BVStatic<272UL>::TestRange(this_00,index,pageCount), index_00 = index,
           BVar7 != '\0')) break;
        index = BVStatic<272UL>::GetNextBit(this_00,index + 1);
      }
      pcVar15 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (index_00 << 0xc);
      if (pageCount < 2) {
LAB_00262c50:
        local_40 = pcVar15;
        local_38 = index_00;
        BVStatic<272UL>::ClearRange(this_00,index_00,pageCount);
        BVar8 = this->freePageCount - pageCount;
        this->freePageCount = BVar8;
        BVar14 = BVStatic<272UL>::Count(this_00);
        if (BVar8 != BVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar6) goto LAB_00262ddb;
          *puVar1 = 0;
        }
        pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar13 = &pPVar3[-1].allocatorType;
        if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        pVVar4 = *(HANDLE *)(pAVar13 + 0x4a);
        pVVar12 = GetCurrentProcess();
        index_00 = local_38;
        if (pVVar4 == pVVar12) {
          BVar11 = VirtualProtect(local_40,(SIZE_T)(ulong)(pageCount << 0xc),4,&local_4c);
          if (BVar11 == 0) {
            AssertCount = AssertCount + 1;
            local_34 = BVar11;
            Js::Throw::LogAssert();
            *puVar1 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x180,"((0))","UNREACHED");
            if (!bVar6) goto LAB_00262ddb;
            pcStack_48 = (char *)0x0;
LAB_00262db1:
            *puVar1 = 0;
            BVar11 = local_34;
          }
          else if (local_4c != 1) {
            AssertCount = AssertCount + 1;
            local_34 = BVar11;
            Js::Throw::LogAssert();
            *puVar1 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
            if (bVar6) goto LAB_00262db1;
            goto LAB_00262ddb;
          }
          if (BVar11 == 0) {
            iVar9 = 1;
            goto LAB_00262dc2;
          }
        }
        iVar9 = 1;
        pcStack_48 = local_40;
      }
      else {
        iVar9 = 0;
        uVar16 = (ulong)pageCount * 0x1000 - 1 & (ulong)pcVar15;
        if (uVar16 != 0) {
          BVar14 = (int)((ulong)pcVar15 % ((ulong)pageCount * 0x1000) >> 0xc) + index_00;
          pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          pAVar13 = &pPVar3[-1].allocatorType;
          if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
            pAVar13 = (AllocatorType *)0x0;
          }
          if (BVar14 < pAVar13[0x28]) {
            local_40 = pcVar15;
            index_00 = BVStatic<272UL>::GetNextBit(this_00,BVar14);
            iVar9 = 8;
            pcVar15 = local_40;
          }
          else {
            iVar9 = 1;
            pcStack_48 = (char *)0x0;
          }
        }
        if (uVar16 == 0) goto LAB_00262c50;
      }
LAB_00262dc2:
      index = index_00;
      local_38 = index_00;
    } while (iVar9 == 8);
  }
  return pcStack_48;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}